

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O2

bool xercesc_4_0::XMLUri::isValidServerBasedAuthority
               (XMLCh *host,int port,XMLCh *userinfo,MemoryManager *manager)

{
  bool bVar1;
  int iVar2;
  XMLSize_t XVar3;
  long lVar4;
  bool bVar5;
  
  bVar1 = isWellFormedAddress(host,manager);
  bVar5 = false;
  if ((port + 1U < 0x10001) && (bVar5 = false, bVar1)) {
    if (userinfo == (XMLCh *)0x0) {
      bVar5 = true;
    }
    else {
      while( true ) {
        bVar5 = *userinfo == L'\0';
        if (bVar5) break;
        bVar1 = isUnreservedCharacter(*userinfo);
        lVar4 = 2;
        if ((!bVar1) &&
           (iVar2 = XMLString::indexOf((XMLCh *)USERINFO_CHARACTERS,*userinfo), iVar2 == -1)) {
          if (*userinfo != L'%') {
            return bVar5;
          }
          XVar3 = XMLString::stringLen(userinfo);
          if (XVar3 < 3) {
            return bVar5;
          }
          bVar1 = XMLString::isHex(userinfo[1]);
          if (!bVar1) {
            return bVar5;
          }
          bVar1 = XMLString::isHex(userinfo[2]);
          lVar4 = 6;
          if (!bVar1) {
            return bVar5;
          }
        }
        userinfo = (XMLCh *)((long)userinfo + lVar4);
      }
    }
  }
  return bVar5;
}

Assistant:

bool XMLUri::isValidServerBasedAuthority(const XMLCh* const host
                                         , const int port
                                         , const XMLCh* const userinfo
                                         , MemoryManager* const manager)
{
    // The order is important, do not change
    if (!isWellFormedAddress(host, manager))
        return false;

    // check port number
    if ((port > 65535) || (port < 0 && port != -1))
        return false;

    // check userinfo
    if (!userinfo)
        return true;

    const XMLCh* tmpStr = userinfo;
    while (*tmpStr)
    {
        if ( isUnreservedCharacter(*tmpStr) ||
            (XMLString::indexOf(USERINFO_CHARACTERS, *tmpStr) != -1))
        {
            tmpStr++;
        }
        else if (*tmpStr == chPercent)               // '%'
        {
            if (XMLString::stringLen(tmpStr) >= 3
                && XMLString::isHex(*(tmpStr+1))     // 1st hex
                && XMLString::isHex(*(tmpStr+2))  )  // 2nd hex
            {
                tmpStr+=3;
            }
            else
                return false;
        }
        else
            return false;
    } //while

    return true;
}